

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smallbuddyrange.h
# Opt level: O0

bool snmalloc::
     BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
     ::equal(Contents k1,Contents k2)

{
  Contents k2_local;
  Contents k1_local;
  
  return k1.unsafe_capptr == k2.unsafe_capptr;
}

Assistant:

static bool equal(Contents k1, Contents k2)
    {
      return address_cast(k1) == address_cast(k2);
    }